

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O1

string * __thiscall
t_st_generator::function_types_comment_abi_cxx11_
          (string *__return_storage_ptr__,t_st_generator *this,t_function *fn)

{
  t_struct *ptVar1;
  pointer pcVar2;
  ostream *poVar3;
  pointer pptVar4;
  ostringstream out;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  ptVar1 = fn->arglist_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
  pptVar4 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar4 !=
      (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pcVar2 = ((*pptVar4)->name_)._M_dataplus._M_p;
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,pcVar2,pcVar2 + ((*pptVar4)->name_)._M_string_length);
      t_generator::camelcase(&local_1e8,(t_generator *)this,&local_1c8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      type_name_abi_cxx11_(&local_208,this,(*pptVar4)->type_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,local_208._M_dataplus._M_p,local_208._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      pptVar4 = pptVar4 + 1;
      if (pptVar4 !=
          (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
    } while (pptVar4 !=
             (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::function_types_comment(t_function* fn) {
  std::ostringstream out;
  const vector<t_field*>& fields = fn->get_arglist()->get_members();
  vector<t_field*>::const_iterator f_iter;

  out << "\"";

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    out << camelcase((*f_iter)->get_name()) << ": " << type_name((*f_iter)->get_type());
    if ((f_iter + 1) != fields.end()) {
      out << ", ";
    }
  }

  out << "\"";

  return out.str();
}